

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O1

void forwarder_data(worker_handle *wh)

{
  conn_handle *conn;
  undefined8 *puVar1;
  proxy_conn_handle *pc;
  undefined8 *puVar2;
  proxy_handle *ppVar3;
  uint uVar4;
  char *pcVar5;
  uint32_t addr;
  uint8_t buf [4096];
  uint32_t local_103c;
  uint8_t local_1038;
  uint32_t local_1037;
  uint local_1033;
  uint8_t local_102f [4095];
  
  pc = (proxy_conn_handle *)wh->func_ctx;
  puVar2 = (undefined8 *)pc->priv;
  memset(&local_1038,0,0x1000);
  local_1038 = '\x05';
  puVar1 = puVar2 + 0x21b;
  proxy_log(pc->ph,LOG_LEVEL_DEBUG,"UDP Data forwarding thread is starting for client \'%s\'\n");
  conn = (conn_handle *)(puVar2 + 5);
  do {
    uVar4 = conn_recv_any(conn,local_102f,0xff7,&local_103c,(uint16_t *)0x0);
    if ((int)uVar4 < 1) {
      if (uVar4 == 0) {
        uVar4 = 0xffffffe0;
      }
    }
    else {
      local_1037 = local_103c;
      local_1033 = uVar4;
      proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Sending UDP_DATA message to client \'%s\' (%d bytes)\n",
                puVar1);
      mutex_lock((mutex_handle *)(puVar2 + 0xe));
      uVar4 = conn_send((conn_handle *)*puVar2,&local_1038,(ulong)local_1033 + 9);
      mutex_unlock((mutex_handle *)(puVar2 + 0xe));
      if ((int)uVar4 < 0) {
        conn_close(conn);
        ppVar3 = pc->ph;
        pcVar5 = strerror(-uVar4);
        proxy_log(ppVar3,LOG_LEVEL_DEBUG,
                  "Client \'%s\' UDP Data thread is returning due to a client connection error (%d): %s\n"
                  ,puVar1,(ulong)-uVar4,pcVar5);
        if ((int)uVar4 < -0x20) {
          if (uVar4 == 0xffffff95) {
            return;
          }
          if (uVar4 == 0xffffff98) {
            return;
          }
        }
        else {
          if (uVar4 == 0xffffffe0) {
            return;
          }
          if (uVar4 == 0xfffffffc) {
            return;
          }
        }
        proxy_conn_drop(pc);
        return;
      }
    }
  } while (-1 < (int)uVar4);
  if ((int)uVar4 < -0x20) {
    if ((uVar4 == 0xffffff95) || (uVar4 == 0xffffff98)) goto LAB_00105f3c;
  }
  else if ((uVar4 == 0xffffffe0) || (uVar4 == 0xfffffffc)) goto LAB_00105f3c;
  ppVar3 = pc->ph;
  pcVar5 = strerror(-uVar4);
  proxy_log(ppVar3,LOG_LEVEL_INFO,
            "Failed to receive data on client \'%s\' UDP Data connection (%d): %s\n",puVar1,
            (ulong)-uVar4,pcVar5);
  proxy_conn_drop(pc);
LAB_00105f3c:
  conn_close(conn);
  proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Client \'%s\' UDP Data worker is returning cleanly\n",puVar1);
  return;
}

Assistant:

static void forwarder_data(struct worker_handle *wh)
{
	struct proxy_conn_handle *pc = wh->func_ctx;
	struct proxy_conn_priv *priv = pc->priv;

	uint32_t addr;
	uint8_t buf[CONN_BUFF_LEN] = { 0 };
	struct proxy_msg *msg = (struct proxy_msg *)buf;
	int ret;

	msg->type = PROXY_MSG_TYPE_UDP_DATA;

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "UDP Data forwarding thread is starting for client '%s'\n",
		  priv->callsign);

	do {
		ret = conn_recv_any(&priv->conn_data, buf + sizeof(*msg),
				    CONN_BUFF_LEN_HEADERLESS, &addr, NULL);
		if (ret > 0) {
			msg->address = addr;
			msg->size = ret;

			proxy_log(pc->ph, LOG_LEVEL_DEBUG,
				  "Sending UDP_DATA message to client '%s' (%d bytes)\n",
				  priv->callsign, msg->size);

			mutex_lock(&priv->mutex_client_send);

			ret = conn_send(priv->conn_client, (uint8_t *)msg,
					sizeof(*msg) + msg->size);

			mutex_unlock(&priv->mutex_client_send);

			/* This is an error with the client connection */
			if (ret < 0) {
				conn_close(&priv->conn_data);

				proxy_log(pc->ph, LOG_LEVEL_DEBUG,
					  "Client '%s' UDP Data thread is returning due to a client connection error (%d): %s\n",
					  priv->callsign, -ret, strerror(-ret));

				switch (ret) {
				case -ECONNRESET:
				case -EINTR:
				case -ENOTCONN:
				case -EPIPE:
					break;
				default:
					proxy_conn_drop(pc);
					break;
				}

				return;
			}
		} else if (ret == 0) {
			ret = -EPIPE;
		}
	} while (ret >= 0);

	switch (ret) {
	case -ECONNRESET:
	case -EINTR:
	case -ENOTCONN:
	case -EPIPE:
		break;
	default:
		proxy_log(pc->ph, LOG_LEVEL_INFO,
			  "Failed to receive data on client '%s' UDP Data connection (%d): %s\n",
			  priv->callsign, -ret, strerror(-ret));
		/* Since the UDP ports must be open while the client is connected,
		 * we should shut down the client if we don't exit cleanly
		 */
		proxy_conn_drop(pc);
		break;
	}

	conn_close(&priv->conn_data);

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "Client '%s' UDP Data worker is returning cleanly\n",
		  priv->callsign);
}